

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOptimizationTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ShaderOptimizationCase::init
          (ShaderOptimizationCase *this,EVP_PKEY_CTX *ctx)

{
  TestLog *pTVar1;
  bool bVar2;
  ProgramData *pPVar3;
  size_type sVar4;
  ShaderProgram *pSVar5;
  SharedPtr<const_glu::ShaderProgram> *pSVar6;
  char *pcVar7;
  TestError *this_00;
  allocator<char> local_181;
  string local_180;
  allocator<char> local_159;
  string local_158;
  ScopedLogSection local_138;
  ScopedLogSection section;
  int local_120;
  int i;
  ProgramData local_110;
  byte local_25;
  int local_24;
  bool optimized;
  TestLog *pTStack_20;
  int ndx;
  TestLog *log;
  RenderContext *renderCtx;
  ShaderOptimizationCase *this_local;
  
  renderCtx = (RenderContext *)this;
  log = (TestLog *)gles3::Context::getRenderContext((this->super_TestCase).m_context);
  pTStack_20 = tcu::TestContext::getLog
                         ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  deqp::gls::ShaderPerformanceMeasurer::logParameters(&this->m_measurer,pTStack_20);
  local_24 = 0;
  while( true ) {
    if (1 < local_24) {
      this->m_state = STATE_INIT_UNOPTIMIZED;
      return (int)this;
    }
    local_25 = local_24 == 1;
    (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[5])
              (&local_110,this,(ulong)local_25);
    pPVar3 = programData(this,(bool)(local_25 & 1));
    ProgramData::operator=(pPVar3,&local_110);
    ProgramData::~ProgramData(&local_110);
    local_120 = 0;
    while( true ) {
      pPVar3 = programData(this,(bool)(local_25 & 1));
      sVar4 = std::vector<deqp::gls::AttribSpec,_std::allocator<deqp::gls::AttribSpec>_>::size
                        (&pPVar3->attributes);
      if ((int)sVar4 <= local_120) break;
      local_120 = local_120 + 1;
    }
    pSVar5 = (ShaderProgram *)operator_new(0xd0);
    pTVar1 = log;
    pPVar3 = programData(this,(bool)(local_25 & 1));
    glu::ShaderProgram::ShaderProgram(pSVar5,(RenderContext *)pTVar1,&pPVar3->sources);
    de::SharedPtr<const_glu::ShaderProgram>::SharedPtr
              ((SharedPtr<const_glu::ShaderProgram> *)&section,pSVar5);
    pSVar6 = program(this,(bool)(local_25 & 1));
    de::SharedPtr<const_glu::ShaderProgram>::operator=
              (pSVar6,(SharedPtr<const_glu::ShaderProgram> *)&section);
    de::SharedPtr<const_glu::ShaderProgram>::~SharedPtr
              ((SharedPtr<const_glu::ShaderProgram> *)&section);
    pTVar1 = pTStack_20;
    pcVar7 = "UnoptimizedProgram";
    if ((local_25 & 1) != 0) {
      pcVar7 = "OptimizedProgram";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_158,pcVar7,&local_159);
    pcVar7 = "Unoptimized program";
    if ((local_25 & 1) != 0) {
      pcVar7 = "Hand-optimized program";
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_180,pcVar7,&local_181);
    tcu::ScopedLogSection::ScopedLogSection(&local_138,pTVar1,&local_158,&local_180);
    std::__cxx11::string::~string((string *)&local_180);
    std::allocator<char>::~allocator(&local_181);
    std::__cxx11::string::~string((string *)&local_158);
    std::allocator<char>::~allocator(&local_159);
    pTVar1 = pTStack_20;
    pSVar6 = program(this,(bool)(local_25 & 1));
    pSVar5 = de::SharedPtr<const_glu::ShaderProgram>::operator*(pSVar6);
    glu::operator<<(pTVar1,pSVar5);
    tcu::ScopedLogSection::~ScopedLogSection(&local_138);
    pSVar6 = program(this,(bool)(local_25 & 1));
    pSVar5 = de::SharedPtr<const_glu::ShaderProgram>::operator->(pSVar6);
    bVar2 = glu::ShaderProgram::isOk(pSVar5);
    if (!bVar2) break;
    local_24 = local_24 + 1;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,"Shader compilation failed",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/performance/es3pShaderOptimizationTests.cpp"
             ,0xf5);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void ShaderOptimizationCase::init (void)
{
	const glu::RenderContext&	renderCtx	= m_context.getRenderContext();
	TestLog&					log			= m_testCtx.getLog();

	m_measurer.logParameters(log);

	for (int ndx = 0; ndx < 2; ndx++)
	{
		const bool optimized = ndx == 1;

		programData(optimized) = generateProgramData(optimized);

		for (int i = 0; i < (int)programData(optimized).attributes.size(); i++)
			DE_ASSERT(programData(optimized).attributes[i].name != "a_position"); // \note Position attribute is set by m_measurer.

		program(optimized) = SharedPtr<const ShaderProgram>(new ShaderProgram(renderCtx, programData(optimized).sources));

		{
			const tcu::ScopedLogSection section(log, optimized ? "OptimizedProgram"			: "UnoptimizedProgram",
													 optimized ? "Hand-optimized program"	: "Unoptimized program");
			log << *program(optimized);
		}

		if (!program(optimized)->isOk())
			TCU_FAIL("Shader compilation failed");
	}

	m_state = STATE_INIT_UNOPTIMIZED;
}